

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

void CloseDest(void)

{
  aint aVar1;
  
  WriteDest();
  if (FP_Output != (FILE *)0x0) {
    if (size != -1) {
      if (destlen - size != 0 && size <= destlen) {
        ErrorInt("File exceeds \'size\' by",destlen - size,PASS3);
      }
      memset(WriteBuffer,0,0x2000);
      while( true ) {
        aVar1 = size - destlen;
        if (aVar1 == 0 || size < destlen) break;
        if (0x1fff < aVar1) {
          aVar1 = 0x2000;
        }
        WBLength = aVar1;
        WriteDest();
      }
      size = -1;
    }
    fclose((FILE *)FP_Output);
    FP_Output = (FILE *)0x0;
  }
  return;
}

Assistant:

void CloseDest() {
	// Flush buffer before any other operations
	WriteDest();
	// does main output file exist? (to close it)
	if (FP_Output == NULL) return;
	// pad to desired size (and check for exceed of it)
	if (size != -1L) {
		if (destlen > size) {
			ErrorInt("File exceeds 'size' by", destlen - size);
		}
		memset(WriteBuffer, 0, DESTBUFLEN);
		while (destlen < size) {
			WBLength = std::min(aint(DESTBUFLEN), size-destlen);
			WriteDest();
		}
		size = -1L;
	}
	fclose(FP_Output);
	FP_Output = NULL;
}